

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_tointegerns(TValue *obj,lua_Integer *p,F2Imod mode)

{
  int iVar1;
  
  if (obj->tt_ == 0x13) {
    *p = (lua_Integer)obj->value_;
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    if (obj->tt_ == 3) {
      iVar1 = luaV_flttointeger((obj->value_).n,p,mode);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int luaV_tointegerns (const TValue *obj, lua_Integer *p, F2Imod mode) {
  if (ttisfloat(obj))
    return luaV_flttointeger(fltvalue(obj), p, mode);
  else if (ttisinteger(obj)) {
    *p = ivalue(obj);
    return 1;
  }
  else
    return 0;
}